

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OSTEI_VRR_Writer.cpp
# Opt level: O0

void __thiscall OSTEI_VRR_Writer::WriteVRR(OSTEI_VRR_Writer *this,ostream *os)

{
  int iVar1;
  int iVar2;
  int iVar3;
  bool bVar4;
  ostream *poVar5;
  int *piVar6;
  QAM *in_RSI;
  long *in_RDI;
  int L;
  QAM *am;
  iterator __end1_3;
  iterator __begin1_3;
  QAMList *__range1_3;
  int *it_2;
  iterator __end1_2;
  iterator __begin1_2;
  IntSet *__range1_2;
  int *it_1;
  iterator __end1_1;
  iterator __begin1_1;
  IntSet *__range1_1;
  int *it;
  iterator __end1;
  iterator __begin1;
  IntSet *__range1;
  undefined4 in_stack_fffffffffffffc98;
  int in_stack_fffffffffffffc9c;
  QAM *in_stack_fffffffffffffca0;
  QAM *in_stack_fffffffffffffca8;
  QAM *in_stack_fffffffffffffcb0;
  OSTEI_VRR_Algorithm_Base *in_stack_fffffffffffffcf8;
  undefined1 local_230 [48];
  undefined1 local_200 [48];
  undefined1 local_1d0 [48];
  int local_1a0;
  allocator local_199;
  string local_198 [80];
  reference local_148;
  QAM *local_140;
  __normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> local_138;
  undefined1 local_130 [24];
  undefined1 *local_118;
  int *local_110;
  _Self local_108;
  _Self local_100;
  undefined1 local_f8 [48];
  undefined1 *local_c8;
  int *local_c0;
  _Self local_b8;
  _Self local_b0;
  undefined1 local_a8 [48];
  undefined1 *local_78;
  int *local_60;
  _Self local_58;
  _Self local_50;
  undefined1 local_48 [48];
  undefined1 *local_18;
  QAM *local_10;
  
  local_10 = in_RSI;
  std::operator<<((ostream *)in_RSI,"\n");
  poVar5 = std::operator<<((ostream *)local_10,(string *)indent5_abi_cxx11_);
  std::operator<<(poVar5,"//////////////////////////////////////////////\n");
  poVar5 = std::operator<<((ostream *)local_10,(string *)indent5_abi_cxx11_);
  std::operator<<(poVar5,"// Primitive integrals: Vertical recurrance\n");
  poVar5 = std::operator<<((ostream *)local_10,(string *)indent5_abi_cxx11_);
  std::operator<<(poVar5,"//////////////////////////////////////////////\n");
  std::operator<<((ostream *)local_10,"\n");
  OSTEI_VRR_Algorithm_Base::GetAllInt_2p(in_stack_fffffffffffffcf8);
  local_18 = local_48;
  local_50._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)
                  CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  local_58._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::end
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)
                  CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  while (bVar4 = std::operator!=(&local_50,&local_58), bVar4) {
    local_60 = std::_Rb_tree_const_iterator<int>::operator*
                         ((_Rb_tree_const_iterator<int> *)0x143bc3);
    if (*local_60 == 1) {
      poVar5 = std::operator<<((ostream *)local_10,(string *)indent5_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,"const SIMINT_DBLTYPE vrr_const_");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*local_60);
      std::operator<<(poVar5,"_over_2p = one_over_2p;\n");
    }
    else {
      poVar5 = std::operator<<((ostream *)local_10,(string *)indent5_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,"const SIMINT_DBLTYPE vrr_const_");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*local_60);
      poVar5 = std::operator<<(poVar5,"_over_2p = SIMINT_MUL(const_");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*local_60);
      std::operator<<(poVar5,", one_over_2p);\n");
    }
    std::_Rb_tree_const_iterator<int>::operator++
              ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffca0);
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x143bb1);
  OSTEI_VRR_Algorithm_Base::GetAllInt_2q(in_stack_fffffffffffffcf8);
  local_78 = local_a8;
  local_b0._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)
                  CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  local_b8._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::end
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)
                  CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  while (bVar4 = std::operator!=(&local_b0,&local_b8), bVar4) {
    local_c0 = std::_Rb_tree_const_iterator<int>::operator*
                         ((_Rb_tree_const_iterator<int> *)0x143dcd);
    if (*local_c0 == 1) {
      poVar5 = std::operator<<((ostream *)local_10,(string *)indent5_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,"const SIMINT_DBLTYPE vrr_const_");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*local_c0);
      std::operator<<(poVar5,"_over_2q = one_over_2q;\n");
    }
    else {
      poVar5 = std::operator<<((ostream *)local_10,(string *)indent5_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,"const SIMINT_DBLTYPE vrr_const_");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*local_c0);
      poVar5 = std::operator<<(poVar5,"_over_2q = SIMINT_MUL(const_");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*local_c0);
      std::operator<<(poVar5,", one_over_2q);\n");
    }
    std::_Rb_tree_const_iterator<int>::operator++
              ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffca0);
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x143dbb);
  OSTEI_VRR_Algorithm_Base::GetAllInt_2pq(in_stack_fffffffffffffcf8);
  local_c8 = local_f8;
  local_100._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::begin
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)
                  CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  local_108._M_node =
       (_Base_ptr)
       std::set<int,_std::less<int>,_std::allocator<int>_>::end
                 ((set<int,_std::less<int>,_std::allocator<int>_> *)
                  CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  while (bVar4 = std::operator!=(&local_100,&local_108), bVar4) {
    local_110 = std::_Rb_tree_const_iterator<int>::operator*
                          ((_Rb_tree_const_iterator<int> *)0x143fd7);
    if (*local_110 == 1) {
      poVar5 = std::operator<<((ostream *)local_10,(string *)indent5_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,"const SIMINT_DBLTYPE vrr_const_");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*local_110);
      std::operator<<(poVar5,"_over_2pq = one_over_2pq;\n");
    }
    else {
      poVar5 = std::operator<<((ostream *)local_10,(string *)indent5_abi_cxx11_);
      poVar5 = std::operator<<(poVar5,"const SIMINT_DBLTYPE vrr_const_");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*local_110);
      poVar5 = std::operator<<(poVar5,"_over_2pq = SIMINT_MUL(const_");
      poVar5 = (ostream *)std::ostream::operator<<(poVar5,*local_110);
      std::operator<<(poVar5,", one_over_2pq);\n");
    }
    std::_Rb_tree_const_iterator<int>::operator++
              ((_Rb_tree_const_iterator<int> *)in_stack_fffffffffffffca0);
  }
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set
            ((set<int,_std::less<int>,_std::allocator<int>_> *)0x143fc5);
  std::operator<<((ostream *)local_10,"\n\n");
  OSTEI_VRR_Algorithm_Base::GetAMOrder
            ((OSTEI_VRR_Algorithm_Base *)
             CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  local_118 = local_130;
  local_138._M_current =
       (QAM *)std::vector<QAM,_std::allocator<QAM>_>::begin
                        ((vector<QAM,_std::allocator<QAM>_> *)
                         CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  local_140 = (QAM *)std::vector<QAM,_std::allocator<QAM>_>::end
                               ((vector<QAM,_std::allocator<QAM>_> *)
                                CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
  while (bVar4 = __gnu_cxx::operator!=
                           ((__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> *)
                            in_stack_fffffffffffffca0,
                            (__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_> *)
                            CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98)), bVar4) {
    local_148 = __gnu_cxx::__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_>::
                operator*(&local_138);
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_198,"",&local_199);
    QAM::QAM(in_stack_fffffffffffffcb0,(int)((ulong)in_stack_fffffffffffffca8 >> 0x20),
             (int)in_stack_fffffffffffffca8,(int)((ulong)in_stack_fffffffffffffca0 >> 0x20),
             (int)in_stack_fffffffffffffca0,
             (string *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
    bVar4 = QAM::operator==(in_stack_fffffffffffffcb0,in_stack_fffffffffffffca8);
    QAM::~QAM((QAM *)0x144273);
    std::__cxx11::string::~string(local_198);
    std::allocator<char>::~allocator((allocator<char> *)&local_199);
    if (!bVar4) {
      piVar6 = QAM::operator[](in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
      iVar1 = *piVar6;
      piVar6 = QAM::operator[](in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
      iVar2 = *piVar6;
      piVar6 = QAM::operator[](in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
      iVar3 = *piVar6;
      piVar6 = QAM::operator[](in_stack_fffffffffffffca0,in_stack_fffffffffffffc9c);
      local_1a0 = iVar1 + iVar2 + iVar3 + *piVar6;
      if (local_1a0 < (int)in_RDI[3]) {
        in_stack_fffffffffffffcb0 = local_10;
        QAM::QAM(in_stack_fffffffffffffca0,
                 (QAM *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        (**(code **)(*in_RDI + 0x18))(in_RDI,in_stack_fffffffffffffcb0,local_1d0);
        QAM::~QAM((QAM *)0x144411);
      }
      else if (local_1a0 < *(int *)((long)in_RDI + 0x1c)) {
        in_stack_fffffffffffffca8 = local_10;
        QAM::QAM(in_stack_fffffffffffffca0,
                 (QAM *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        (**(code **)(*in_RDI + 0x20))(in_RDI,in_stack_fffffffffffffca8,local_200);
        QAM::~QAM((QAM *)0x1444ba);
      }
      else {
        in_stack_fffffffffffffca0 = local_10;
        QAM::QAM(local_10,(QAM *)CONCAT44(in_stack_fffffffffffffc9c,in_stack_fffffffffffffc98));
        (**(code **)(*in_RDI + 0x28))(in_RDI,in_stack_fffffffffffffca0,local_230);
        QAM::~QAM((QAM *)0x144536);
      }
      std::operator<<((ostream *)local_10,"\n\n");
    }
    __gnu_cxx::__normal_iterator<QAM_*,_std::vector<QAM,_std::allocator<QAM>_>_>::operator++
              (&local_138);
  }
  std::vector<QAM,_std::allocator<QAM>_>::~vector
            ((vector<QAM,_std::allocator<QAM>_> *)in_stack_fffffffffffffcb0);
  return;
}

Assistant:

void OSTEI_VRR_Writer::WriteVRR(std::ostream & os) const
{
    os << "\n";
    os << indent5 << "//////////////////////////////////////////////\n";
    os << indent5 << "// Primitive integrals: Vertical recurrance\n";
    os << indent5 << "//////////////////////////////////////////////\n";
    os << "\n";

    // constants
    for(const auto & it : vrr_algo_.GetAllInt_2p())
    {
        if(it == 1)
            os << indent5 << "const SIMINT_DBLTYPE vrr_const_" << it << "_over_2p = one_over_2p;\n"; 
        else
            os << indent5 << "const SIMINT_DBLTYPE vrr_const_" << it << "_over_2p = SIMINT_MUL(const_" << it << ", one_over_2p);\n";
    }

    for(const auto & it : vrr_algo_.GetAllInt_2q())
    {
        if(it == 1)
            os << indent5 << "const SIMINT_DBLTYPE vrr_const_" << it << "_over_2q = one_over_2q;\n"; 
        else
            os << indent5 << "const SIMINT_DBLTYPE vrr_const_" << it << "_over_2q = SIMINT_MUL(const_" << it << ", one_over_2q);\n";
    }

    for(const auto & it : vrr_algo_.GetAllInt_2pq())
    {
        if(it == 1)
            os << indent5 << "const SIMINT_DBLTYPE vrr_const_" << it << "_over_2pq = one_over_2pq;\n"; 
        else
            os << indent5 << "const SIMINT_DBLTYPE vrr_const_" << it << "_over_2pq = SIMINT_MUL(const_" << it << ", one_over_2pq);\n";
    }

    os << "\n\n";

    // actually write out
    for(const auto & am : vrr_algo_.GetAMOrder())
    {
        if(am == QAM{0,0,0,0})
            continue;

        int L = am[0] + am[1] + am[2] + am[3];
        if(L < start_external_)
            WriteVRR_Inline_(os, am);
        else if(L < start_general_)
            WriteVRR_External_(os, am);
        else
            WriteVRR_General_(os, am);

        os << "\n\n";
    }
    
}